

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXBigInteger.cpp
# Opt level: O0

string * __thiscall ZXing::BigInteger::toString_abi_cxx11_(BigInteger *this)

{
  initializer_list<unsigned_long> __l;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  Magnitude *in_RSI;
  string *in_RDI;
  size_t offset;
  Magnitude lastDigit;
  Magnitude buBase;
  Magnitude x2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_t maxDigitLenOfX;
  int minBitsPerDigit;
  size_t maxBitLenOfX;
  string *result;
  value_type_conflict *in_stack_fffffffffffffe98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea0;
  pointer *__n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb0;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffec0;
  allocator_type *in_stack_fffffffffffffec8;
  allocator<char> *in_stack_fffffffffffffed0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffee8;
  string *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  undefined1 local_c1;
  char local_c0 [31];
  undefined1 local_a1 [73];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ulong local_40;
  int local_34;
  long local_30;
  uint in_stack_ffffffffffffffd8;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffdc;
  Magnitude *in_stack_ffffffffffffffe0;
  Magnitude *in_stack_ffffffffffffffe8;
  Magnitude *a;
  
  this_01 = in_RDI;
  a = in_RSI;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (in_stack_fffffffffffffeb0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  }
  else {
    in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 & 0xffffff;
    std::__cxx11::string::string((string *)this_01);
    if (((ulong)(in_RSI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start & 1) != 0) {
      std::__cxx11::string::push_back((char)this_01);
    }
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &(in_RSI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_finish);
    local_30 = (sVar3 & 0xffffffff) << 6;
    iVar2 = BitHacks::HighestBitSet(0);
    local_40 = (ulong)(local_30 + -1 + (long)iVar2) / (ulong)(long)iVar2;
    pvVar6 = &local_58;
    local_34 = iVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b4a25);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed0,
               (size_type)in_stack_fffffffffffffec8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,
               in_stack_fffffffffffffee8);
    local_a1._1_8_ = 10;
    local_a1._9_8_ = local_a1 + 1;
    local_a1._17_8_ = 1;
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a1;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2b4a8b);
    __l._M_len._0_4_ = in_stack_fffffffffffffee0;
    __l._M_array = (iterator)pvVar6;
    __l._M_len._4_4_ = iVar2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (this_00,__l,in_stack_fffffffffffffec8);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2b4abc);
    _Var5._M_current = local_c0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b4ace);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (this_00,(size_type)_Var5._M_current);
    while (bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                             (in_stack_fffffffffffffeb0), ((bVar1 ^ 0xffU) & 1) != 0) {
      DivideWithRemainder(a,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                          (Magnitude *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                         );
      bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        (in_stack_fffffffffffffeb0);
      if (bVar1) {
        in_stack_fffffffffffffec0 =
             (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)0x0;
      }
      else {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffea0);
        in_stack_fffffffffffffec0 =
             (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)*pvVar4;
      }
      local_c1 = SUB81(in_stack_fffffffffffffec0,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    __last = (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)std::__cxx11::string::size();
    local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)__last;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_58);
    std::__cxx11::string::resize((ulong)this_01);
    __n = &local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rbegin(in_stack_fffffffffffffea8);
    pvVar6 = &local_e0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rend(pvVar6);
    std::__cxx11::string::begin();
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)pvVar6,(difference_type)__n);
    _Var5 = std::
            transform<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(int)>
                      (in_stack_fffffffffffffec0,__last,_Var5,
                       (_func_char_int *)in_stack_fffffffffffffeb0);
    uVar7 = 0x1000000;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)_Var5._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)_Var5._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)_Var5._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_Var5._M_current);
    if ((uVar7 & 0x1000000) == 0) {
      std::__cxx11::string::~string((string *)this_01);
    }
  }
  return in_RDI;
}

Assistant:

std::string
BigInteger::toString() const
{
	if (mag.empty()) {
		return "0";
	}
	std::string result;
	if (negative) {
		result.push_back('-');
	}

	static const uint32_t base = 10;
	auto maxBitLenOfX = static_cast<uint32_t>(mag.size()) * NB_BITS;
	int minBitsPerDigit = BitHacks::HighestBitSet(base);
	auto maxDigitLenOfX = (maxBitLenOfX + minBitsPerDigit - 1) / minBitsPerDigit; // ceilingDiv
	
	std::vector<uint8_t> buffer;
	buffer.reserve(maxDigitLenOfX);

	Magnitude x2 = mag;
	Magnitude buBase{base};
	Magnitude lastDigit;
	lastDigit.reserve(1);

	while (!x2.empty()) {
		// Get last digit.  This is like `lastDigit = x2 % buBase, x2 /= buBase'.
		DivideWithRemainder(x2, buBase, x2, lastDigit);
		// Save the digit.
		buffer.push_back(static_cast<uint8_t>(lastDigit.empty() ? 0 : lastDigit.front()));
	}

	size_t offset = result.size();
	result.resize(offset + buffer.size());
	std::transform(buffer.rbegin(), buffer.rend(), result.begin() + offset, ToDigit<char>);
	return result;
}